

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O2

bool __thiscall
chatra::ArgumentMatcher::matches
          (ArgumentMatcher *this,
          vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *args,
          vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *subArgs)

{
  Class *pCVar1;
  Class *cl;
  pointer pAVar2;
  bool bVar3;
  const_iterator cVar4;
  pointer pAVar5;
  pointer pAVar6;
  long lVar7;
  pointer pAVar8;
  size_t i;
  ulong uVar9;
  ArgumentSpec *arg;
  long lVar10;
  ulong uVar11;
  long local_40;
  
  pAVar5 = (args->super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (((long)(args->super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>)
             ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar5 != 0x10) ||
     (bVar3 = true, pAVar5->key != AnyArgs)) {
    pAVar5 = (subArgs->
             super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pAVar6 = (subArgs->
             super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if ((long)pAVar6 - (long)pAVar5 >> 4 ==
        ((long)(this->subArgs).
               super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl
               .super__Vector_impl_data._M_finish -
        (long)(this->subArgs).
              super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18) {
      lVar7 = 8;
      lVar10 = lVar7;
      for (uVar9 = 0; uVar9 < (ulong)((long)pAVar6 - (long)pAVar5 >> 4); uVar9 = uVar9 + 1) {
        pCVar1 = *(Class **)
                  ((long)&((this->subArgs).
                           super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>
                           ._M_impl.super__Vector_impl_data._M_start)->type + lVar7);
        if ((pCVar1 != (Class *)0x0) &&
           (cl = *(Class **)((long)&pAVar5->key + lVar10), cl != (Class *)0x0)) {
          bVar3 = Class::isAssignableFrom(pCVar1,cl);
          if (!bVar3) goto LAB_00198888;
          pAVar5 = (subArgs->
                   super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pAVar6 = (subArgs->
                   super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        lVar10 = lVar10 + 0x10;
        lVar7 = lVar7 + 0x18;
      }
      pAVar5 = (args->
               super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pAVar6 = (args->
               super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      local_40 = 0;
      uVar9 = 0;
      for (; pAVar5 != pAVar6; pAVar5 = pAVar5 + 1) {
        uVar11 = uVar9;
        if (uVar9 < this->listCount) {
          pAVar8 = (this->args).
                   super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((pAVar5->key != Invalid) &&
             (uVar11 = this->listCount, pAVar5->key != pAVar8[uVar9].name)) goto LAB_00198813;
          uVar11 = uVar9 + 1;
          pAVar8 = pAVar8 + uVar9;
          if ((pAVar8->cl != (Class *)0x0) &&
             ((pAVar5->cl != (Class *)0x0 &&
              (bVar3 = Class::isAssignableFrom(pAVar8->cl,pAVar5->cl), !bVar3)))) {
            uVar11 = this->listCount;
            goto LAB_00198813;
          }
LAB_0019886e:
          local_40 = local_40 + (ulong)(pAVar8->defaultOp == (Node *)0x0);
        }
        else {
LAB_00198813:
          if ((pAVar5->key != Invalid) &&
             (cVar4 = std::
                      _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_unsigned_long>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&(this->byName)._M_h,&pAVar5->key),
             cVar4.
             super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>.
             _M_cur != (__node_type *)0x0)) {
            pAVar2 = (this->args).
                     super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pAVar8 = pAVar2 + *(long *)((long)cVar4.
                                              super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                                              ._M_cur + 0x10);
            pCVar1 = pAVar2[*(long *)((long)cVar4.
                                            super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                                            ._M_cur + 0x10)].cl;
            if ((pCVar1 == (Class *)0x0) ||
               ((pAVar5->cl == (Class *)0x0 ||
                (bVar3 = Class::isAssignableFrom(pCVar1,pAVar5->cl), bVar3)))) goto LAB_0019886e;
            goto LAB_00198888;
          }
          if ((this->hasListVarArg == false) &&
             ((pAVar5->key == Invalid || (this->hasDictVarArg == false)))) goto LAB_00198888;
        }
        uVar9 = uVar11;
      }
      bVar3 = local_40 == this->listCountWithoutDefaults + this->dictCountWithoutDefaults &&
              this->listCountWithoutDefaults <= uVar9;
    }
    else {
LAB_00198888:
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool ArgumentMatcher::matches(const std::vector<ArgumentSpec>& args, const std::vector<ArgumentSpec>& subArgs) const {

	if (args.size() == 1 && args[0].key == StringId::AnyArgs)
		return true;

	if (subArgs.size() != this->subArgs.size())
		return false;
	for (size_t i = 0; i < subArgs.size(); i++) {
		auto& arg0 = this->subArgs[i];
		auto& arg1 = subArgs[i];
		if (arg0.cl != nullptr && arg1.cl != nullptr && !arg0.cl->isAssignableFrom(arg1.cl))
			return false;
	}

	size_t index = 0;
	size_t matchedCountWithoutDefaults = 0;

	for (auto& arg : args) {
		if (index < listCount) {
			auto& target = this->args[index++];
			if ((arg.key == StringId::Invalid || arg.key == target.name) &&
					(target.cl == nullptr || arg.cl == nullptr || target.cl->isAssignableFrom(arg.cl))) {
				if (target.defaultOp == nullptr)
					matchedCountWithoutDefaults++;
				continue;
			}
			index = listCount;
		}
		if (arg.key != StringId::Invalid) {
			auto it = byName.find(arg.key);
			if (it != byName.end()) {
				auto& target = this->args[it->second];
				if (target.cl != nullptr && arg.cl != nullptr && !target.cl->isAssignableFrom(arg.cl))
					return false;
				if (target.defaultOp == nullptr)
					matchedCountWithoutDefaults++;
				continue;
			}
		}
		if (hasListVarArg || (arg.key != StringId::Invalid && hasDictVarArg))
			continue;
		return false;
	}

	return index >= listCountWithoutDefaults &&
			matchedCountWithoutDefaults == listCountWithoutDefaults + dictCountWithoutDefaults;
}